

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O1

void test_AString_appendAString_success_zeroSizeSrcArray_fn(int _i)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *expr;
  char *pcVar5;
  char **ppcVar6;
  char **ppcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcStack_c0;
  char *pcStack_b8;
  char *pcStack_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  undefined8 uStack_90;
  AString srcString;
  AString destString;
  
  destString.reallocator._0_4_ = 0x11e238;
  destString.reallocator._4_4_ = 0;
  destString.deallocator._0_4_ = 0x11e278;
  destString.deallocator._4_4_ = 0;
  destString.buffer = (char *)0x0;
  destString.size = 5;
  destString.capacity = 8;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_90 = 0x12cf02;
  destString.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,9);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  builtin_strncpy(destString.buffer,"01234",6);
  srcString.buffer = (char *)0x0;
  srcString.reallocator._0_4_ = 0x11e238;
  srcString.reallocator._4_4_ = 0;
  srcString.deallocator._0_4_ = 0x11e278;
  srcString.deallocator._4_4_ = 0;
  srcString.size = 0;
  srcString.capacity = 8;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_90 = 0x12cf5e;
  srcString.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,9);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  *srcString.buffer = '\0';
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_90 = 0x12cf8c;
  bVar1 = AString_appendAString(&destString,&srcString);
  if (bVar1 == false) {
    uStack_90 = 0x12d11e;
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x42c,"Assertion \'AString_appendAString(&destString, &srcString)\' failed",0
                      ,0);
  }
  uStack_90 = 0x12cfa5;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x42c);
  if (destString.capacity == 8) {
    uStack_90 = 0x12cfc5;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x42d);
    if (destString.buffer == (char *)0x0) {
      ppcVar7 = &local_98;
      pcVar5 = "Assertion \'_ck_x != NULL\' failed";
      pcVar4 = "Assertion \'%s\' failed: %s == %#x";
      pcVar8 = "(void*) (destString).buffer != NULL";
      pcVar9 = "(void*) (destString).buffer";
      iVar2 = 0x42d;
LAB_0012d380:
      uStack_90 = 0;
      local_98 = (char *)0x0;
      *(code **)((long)ppcVar7 + -8) = test_AString_appendAString_failure_bufferExpansionFailed_fn;
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,iVar2,pcVar5,pcVar4,pcVar8,pcVar9);
    }
    uStack_90 = 0x12cfe2;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x42d);
    pcVar9 = destString.buffer;
    if (destString.buffer == (char *)0x0) {
      pcVar4 = "";
      pcVar9 = "(null)";
    }
    else {
      uStack_90 = 0x12cfff;
      iVar2 = strcmp("01234",destString.buffer);
      if (iVar2 == 0) {
        uStack_90 = 0x12d018;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x42d);
        if (destString.size == 5) {
          uStack_90 = 0x12d038;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x42d);
          if (srcString.capacity == 8) {
            uStack_90 = 0x12d058;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x42e);
            if (srcString.buffer == (char *)0x0) {
              ppcVar7 = &local_98;
              pcVar5 = "Assertion \'_ck_x != NULL\' failed";
              pcVar4 = "Assertion \'%s\' failed: %s == %#x";
              pcVar8 = "(void*) (srcString).buffer != NULL";
              pcVar9 = "(void*) (srcString).buffer";
            }
            else {
              uStack_90 = 0x12d075;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x42e);
              if (srcString.buffer == (char *)0x0) {
                pcStack_c0 = "(null)";
                pcStack_b8 = "";
LAB_0012d2aa:
                uStack_90 = 0;
                local_98 = "\"";
                local_a0 = "";
                local_a8 = "\"";
                pcStack_b0 = "(\"\")";
                _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                  ,0x42e,
                                  "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                                  ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                                  "(srcString).buffer == (\"\")","(srcString).buffer",pcStack_b8);
              }
              if (*srcString.buffer != '\0') {
                pcStack_b8 = "\"";
                pcStack_c0 = srcString.buffer;
                goto LAB_0012d2aa;
              }
              uStack_90 = 0x12d0a5;
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x42e);
              if (srcString.size == 0) {
                uStack_90 = 0x12d0c4;
                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                            ,0x42e);
                if (private_ACUtilsTest_AString_reallocCount == 0) {
                  uStack_90 = 0x12d0e5;
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x42f);
                  uStack_90 = 0x12d0ee;
                  (*(code *)CONCAT44(destString.deallocator._4_4_,destString.deallocator._0_4_))
                            (destString.buffer);
                  uStack_90 = 0x12d0f7;
                  (*(code *)CONCAT44(srcString.deallocator._4_4_,srcString.deallocator._0_4_))
                            (srcString.buffer);
                  return;
                }
                ppcVar7 = &local_a8;
                local_a0 = "(0)";
                local_a8 = (char *)private_ACUtilsTest_AString_reallocCount;
                pcVar5 = "Assertion \'_ck_x == _ck_y\' failed";
                pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                pcVar8 = "private_ACUtilsTest_AString_reallocCount == (0)";
                pcVar9 = "private_ACUtilsTest_AString_reallocCount";
                iVar2 = 0x42f;
                goto LAB_0012d380;
              }
              ppcVar7 = &local_a8;
              local_a0 = "strlen(\"\")";
              local_a8 = (char *)srcString.size;
              pcVar5 = "Assertion \'_ck_x == _ck_y\' failed";
              pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
              pcVar8 = "(srcString).size == strlen(\"\")";
              pcVar9 = "(srcString).size";
            }
            iVar2 = 0x42e;
            goto LAB_0012d380;
          }
          pcVar5 = "(srcString).capacity == (8)";
          pcVar8 = "(srcString).capacity";
          iVar2 = 0x42e;
          pcVar4 = (char *)srcString.capacity;
          goto LAB_0012d255;
        }
        local_a0 = "strlen(\"01234\")";
        pcVar5 = "(destString).size == strlen(\"01234\")";
        pcVar8 = "(destString).size";
        iVar2 = 0x42d;
        local_98 = (char *)0x5;
        pcVar4 = (char *)destString.size;
        goto LAB_0012d25b;
      }
      pcVar4 = "\"";
    }
    expr = 
    "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
    ;
    pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
    pcVar5 = "(destString).buffer == (\"01234\")";
    pcVar8 = "(destString).buffer";
    iVar2 = 0x42d;
    local_98 = "\"";
    local_a0 = "01234";
    local_a8 = "\"";
    pcStack_b0 = "(\"01234\")";
    ppcVar6 = &pcStack_c0;
    pcStack_c0 = pcVar9;
    pcStack_b8 = pcVar4;
  }
  else {
    pcVar5 = "(destString).capacity == (8)";
    pcVar8 = "(destString).capacity";
    iVar2 = 0x42d;
    pcVar4 = (char *)destString.capacity;
LAB_0012d255:
    local_a0 = "(8)";
    local_98 = (char *)0x8;
LAB_0012d25b:
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    ppcVar6 = &local_a0;
  }
  uStack_90 = 0;
  *(char **)((long)ppcVar6 + -8) = pcVar4;
  *(undefined8 *)((long)ppcVar6 + -0x10) = 0x12d264;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar2,expr,pcVar3,pcVar5,pcVar8);
}

Assistant:

END_TEST
START_TEST(test_AString_appendAString_success_zeroSizeSrcArray)
{
    struct AString destString = private_ACUtilsTest_AString_constructTestString("01234", 8);
    struct AString srcString = private_ACUtilsTest_AString_constructTestString("", 8);
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    ACUTILSTEST_ASSERT(AString_appendAString(&destString, &srcString));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(destString, "01234", 8);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(srcString, "", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    private_ACUtilsTest_AString_destructTestString(destString);
    private_ACUtilsTest_AString_destructTestString(srcString);
}